

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

tmsize_t TIFFWriteRawStrip(TIFF *tif,uint32_t strip,void *data,tmsize_t cc)

{
  int iVar1;
  TIFF *local_48;
  uint local_3c;
  TIFFDirectory *td;
  tmsize_t cc_local;
  void *data_local;
  uint32_t strip_local;
  TIFF *tif_local;
  
  if (((tif->tif_flags & 0x40) == 0) &&
     (iVar1 = TIFFWriteCheck(tif,0,"TIFFWriteRawStrip"), iVar1 == 0)) {
    return -1;
  }
  if ((tif->tif_dir).td_nstrips <= strip) {
    if ((tif->tif_dir).td_planarconfig == 2) {
      TIFFErrorExtR(tif,"TIFFWriteRawStrip",
                    "Can not grow image by strips when using separate planes");
      return -1;
    }
    if ((tif->tif_dir).td_stripsperimage <= strip) {
      if ((tif->tif_dir).td_imagelength < -((tif->tif_dir).td_rowsperstrip - 1) - 1) {
        local_3c = ((tif->tif_dir).td_imagelength + ((tif->tif_dir).td_rowsperstrip - 1)) /
                   (tif->tif_dir).td_rowsperstrip;
      }
      else {
        local_3c = 0;
      }
      (tif->tif_dir).td_stripsperimage = local_3c;
    }
    iVar1 = TIFFGrowStrips(tif,1,"TIFFWriteRawStrip");
    if (iVar1 == 0) {
      return -1;
    }
  }
  if (tif->tif_curstrip != strip) {
    tif->tif_curstrip = strip;
    tif->tif_curoff = 0;
  }
  if ((tif->tif_dir).td_stripsperimage == 0) {
    TIFFErrorExtR(tif,"TIFFWriteRawStrip","Zero strips per image");
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  else {
    tif->tif_row = (strip % (tif->tif_dir).td_stripsperimage) * (tif->tif_dir).td_rowsperstrip;
    iVar1 = TIFFAppendToStrip(tif,strip,(uint8_t *)data,cc);
    local_48 = (TIFF *)cc;
    if (iVar1 == 0) {
      local_48 = (TIFF *)0xffffffffffffffff;
    }
    tif_local = local_48;
  }
  return (tmsize_t)tif_local;
}

Assistant:

tmsize_t TIFFWriteRawStrip(TIFF *tif, uint32_t strip, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteRawStrip";
    TIFFDirectory *td = &tif->tif_dir;

    if (!WRITECHECKSTRIPS(tif, module))
        return ((tmsize_t)-1);
    /*
     * Check strip array to make sure there's space.
     * We don't support dynamically growing files that
     * have data organized in separate bitplanes because
     * it's too painful.  In that case we require that
     * the imagelength be set properly before the first
     * write (so that the strips array will be fully
     * allocated above).
     */
    if (strip >= td->td_nstrips)
    {
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        {
            TIFFErrorExtR(
                tif, module,
                "Can not grow image by strips when using separate planes");
            return ((tmsize_t)-1);
        }
        /*
         * Watch out for a growing image.  The value of
         * strips/image will initially be 1 (since it
         * can't be deduced until the imagelength is known).
         */
        if (strip >= td->td_stripsperimage)
            td->td_stripsperimage =
                TIFFhowmany_32(td->td_imagelength, td->td_rowsperstrip);
        if (!TIFFGrowStrips(tif, 1, module))
            return ((tmsize_t)-1);
    }

    if (tif->tif_curstrip != strip)
    {
        tif->tif_curstrip = strip;

        /* this informs TIFFAppendToStrip() we have changed or reset strip */
        tif->tif_curoff = 0;
    }

    if (td->td_stripsperimage == 0)
    {
        TIFFErrorExtR(tif, module, "Zero strips per image");
        return ((tmsize_t)-1);
    }
    tif->tif_row = (strip % td->td_stripsperimage) * td->td_rowsperstrip;
    return (TIFFAppendToStrip(tif, strip, (uint8_t *)data, cc) ? cc
                                                               : (tmsize_t)-1);
}